

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O1

EmulNet * __thiscall EmulNet::operator=(EmulNet *this,EmulNet *anotherEmulNet)

{
  int iVar1;
  int (*paiVar2) [3600];
  int (*paiVar3) [3600];
  long lVar4;
  long lVar5;
  
  this->par = anotherEmulNet->par;
  this->enInited = anotherEmulNet->enInited;
  paiVar2 = this->sent_msgs;
  paiVar3 = anotherEmulNet->recv_msgs;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      (*paiVar2)[lVar5] = paiVar3[-0x3e9][lVar5];
      paiVar2[0x3e9][lVar5] = (*paiVar3)[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xe10);
    lVar4 = lVar4 + 1;
    paiVar3 = paiVar3 + 1;
    paiVar2 = paiVar2 + 1;
  } while (lVar4 != 1000);
  (this->emulnet).nextid = (anotherEmulNet->emulnet).nextid;
  iVar1 = (anotherEmulNet->emulnet).currbuffsize;
  (this->emulnet).currbuffsize = iVar1;
  (this->emulnet).firsteltindex = (anotherEmulNet->emulnet).firsteltindex;
  if (0 < (long)iVar1) {
    lVar4 = (long)iVar1 + 0x36fc96;
    do {
      *(undefined8 *)((long)(this->sent_msgs + -1) + 0x3830 + lVar4 * 8) =
           *(undefined8 *)((long)(anotherEmulNet->sent_msgs + -1) + 0x3830 + lVar4 * 8);
      lVar5 = lVar4 + -0x36fc96;
      lVar4 = lVar4 + -1;
    } while (1 < lVar5);
  }
  return this;
}

Assistant:

EmulNet& EmulNet::operator =(EmulNet &anotherEmulNet) {
	int i, j;
	this->par = anotherEmulNet.par;
	this->enInited = anotherEmulNet.enInited;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			this->sent_msgs[i][j] = anotherEmulNet.sent_msgs[i][j];
			this->recv_msgs[i][j] = anotherEmulNet.recv_msgs[i][j];
		}
	}
	this->emulnet = anotherEmulNet.emulnet;
	return *this;
}